

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O3

error_code pstore::exchange::import_ns::fragment_sections::check_fragment(fragment *f)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  error_category *peVar4;
  debug_line_section *pdVar5;
  generic_section *s;
  byte *pbVar6;
  byte *pbVar7;
  error_category *peVar8;
  uint uVar9;
  byte bVar10;
  error e;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  bool bVar15;
  container<unsigned_char> cVar16;
  error_code eVar17;
  
  peVar4 = (error_category *)std::_V2::system_category();
  uVar9 = (f->arr_).sa_.bitmap_;
  peVar8 = peVar4;
  uVar3 = 0;
  if ((ulong)uVar9 != 0) {
    uVar2 = bit_count::ctz((ulong)uVar9);
    bVar10 = (byte)uVar2 & 0x1f;
    uVar14 = uVar9 >> bVar10;
    uVar3 = 0;
    if (uVar9 >> bVar10 != 0) {
      do {
        uVar3 = 0;
        switch(uVar2 & 0xff) {
        case 0:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)0,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 1:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)1,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 2:
          repo::fragment::
          at_impl<(pstore::repo::section_kind)2,pstore::repo::fragment_const&,pstore::repo::bss_section_const>
                    (f);
          e = none;
          goto LAB_0011fb04;
        case 3:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)3,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 4:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)4,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 5:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)5,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 6:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)6,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 7:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)7,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 8:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)8,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 9:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)9,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 10:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)10,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 0xb:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)11,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 0xc:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)12,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 0xd:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)13,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 0xe:
          pdVar5 = repo::fragment::
                   at_impl<(pstore::repo::section_kind)14,pstore::repo::fragment_const&,pstore::repo::debug_line_section_const>
                             (f);
          cVar16 = repo::generic_section::payload(&pdVar5->g_);
          pbVar6 = (byte *)((ulong)(cVar16.end_ + 7) & 0xfffffffffffffff8);
          uVar11 = (ulong)((pdVar5->g_).field_0.field32_ >> 5 & 0xfffffff8) * 3;
          pbVar1 = pbVar6 + uVar11;
          uVar9 = (f->arr_).sa_.bitmap_;
          lVar12 = (long)((uVar11 >> 3) * -0x5555555555555555) >> 2;
          pbVar7 = pbVar6;
          if (0 < lVar12) {
            pbVar7 = pbVar6 + lVar12 * 0x60;
            lVar13 = lVar12 + 1;
            pbVar6 = pbVar6 + 0x30;
            do {
              if ((0x1f < pbVar6[-0x30]) || ((1 << (pbVar6[-0x30] & 0x1f) & uVar9) == 0)) {
                pbVar6 = pbVar6 + -0x30;
                goto LAB_0011faf4;
              }
              if ((0x1f < pbVar6[-0x18]) || ((1 << (pbVar6[-0x18] & 0x1f) & uVar9) == 0)) {
                pbVar6 = pbVar6 + -0x18;
                goto LAB_0011faf4;
              }
              if ((0x1f < *pbVar6) || ((1 << (*pbVar6 & 0x1f) & uVar9) == 0)) goto LAB_0011faf4;
              if ((0x1f < pbVar6[0x18]) || ((1 << (pbVar6[0x18] & 0x1f) & uVar9) == 0)) {
                pbVar6 = pbVar6 + 0x18;
                goto LAB_0011faf4;
              }
              lVar13 = lVar13 + -1;
              pbVar6 = pbVar6 + 0x60;
            } while (1 < lVar13);
            uVar11 = uVar11 + lVar12 * -0x60;
          }
          lVar12 = ((long)uVar11 >> 3) * -0x5555555555555555;
          if (lVar12 == 1) {
LAB_0011f9c5:
            pbVar6 = pbVar7;
            if ((*pbVar7 < 0x20) && ((1 << (*pbVar7 & 0x1f) & uVar9) != 0)) {
              pbVar6 = pbVar1;
            }
          }
          else if (lVar12 == 2) {
LAB_0011f9a7:
            pbVar6 = pbVar7;
            if ((*pbVar7 < 0x20) && ((1 << (*pbVar7 & 0x1f) & uVar9) != 0)) {
              pbVar7 = pbVar7 + 0x18;
              goto LAB_0011f9c5;
            }
          }
          else {
            pbVar6 = pbVar1;
            if (((lVar12 == 3) && (pbVar6 = pbVar7, *pbVar7 < 0x20)) &&
               ((1 << (*pbVar7 & 0x1f) & uVar9) != 0)) {
              pbVar7 = pbVar7 + 0x18;
              goto LAB_0011f9a7;
            }
          }
LAB_0011faf4:
          e = internal_fixup_target_not_found;
          if (pbVar6 == pbVar1) {
            e = none;
          }
LAB_0011fb04:
          eVar17 = make_error_code(e);
          goto LAB_0011faab;
        case 0xf:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)15,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 0x10:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)16,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 0x11:
          s = repo::fragment::
              at_impl<(pstore::repo::section_kind)17,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                        (f);
          break;
        case 0x12:
          repo::fragment::
          at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment_const&,pstore::repo::linked_definitions_const>
                    (f);
          uVar3 = 0;
          peVar8 = peVar4;
          goto switchD_0011f856_default;
        case 0x13:
          assert_failed("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                        ,0x99);
        default:
          goto switchD_0011f856_default;
        }
        eVar17 = anon_unknown.dwarf_14745b::validate_section_ifixups<pstore::repo::generic_section>
                           (f,s);
LAB_0011faab:
        peVar8 = eVar17._M_cat;
        uVar3 = eVar17._M_value;
switchD_0011f856_default:
        uVar9 = uVar14 >> 1;
        bVar10 = (char)uVar2 + 1;
        bVar15 = 1 < uVar14;
        uVar14 = uVar9;
        if (bVar15) {
          uVar2 = bit_count::ctz((ulong)uVar9);
          uVar14 = uVar9 >> ((byte)uVar2 & 0x1f);
          bVar10 = bVar10 + (byte)uVar2;
        }
        uVar2 = (uint)bVar10;
      } while ((uVar14 != 0) && (uVar3 == 0));
    }
  }
  eVar17._4_4_ = 0;
  eVar17._M_value = uVar3;
  eVar17._M_cat = peVar8;
  return eVar17;
}

Assistant:

std::error_code fragment_sections::check_fragment (repo::fragment const & f) {
                std::error_code error;
                for (auto it = f.begin (), end = f.end (); it != end && !error; ++it) {
                    repo::section_kind const kind = *it;
#define X(k)                                                                                       \
    case repo::section_kind::k:                                                                    \
        error = validate_section_ifixups (f, f.at<repo::section_kind::k> ());                      \
        break;
                    switch (kind) {
                        PSTORE_MCREPO_SECTION_KINDS
                    case repo::section_kind::last:
                        PSTORE_ASSERT (false); //! OCLINT(PH - don't warn about the assert macro)
                        break;
                    }
#undef X
                }
                return error;
            }